

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

int NextFile(Context *context)

{
  FILE *pFVar1;
  int iVar2;
  size_t sVar3;
  int64_t iVar4;
  char *__s;
  size_t sVar5;
  char *pcVar6;
  size_t name_len;
  char *name_suffix;
  char *name;
  size_t suffix_len;
  size_t arg_len;
  char *arg;
  Context *context_local;
  
  context->iterator = context->iterator + 1;
  context->input_file_length = -1;
  if (context->input_count == 0) {
    if (context->iterator < 2) {
      context->current_input_path = (char *)0x0;
      context->current_output_path = context->output_path;
      context_local._4_4_ = 1;
    }
    else {
      context_local._4_4_ = 0;
    }
  }
  else {
    while (context->iterator == context->not_input_indices[context->ignore]) {
      context->iterator = context->iterator + 1;
      context->ignore = context->ignore + 1;
    }
    if (context->iterator < context->argc) {
      pcVar6 = context->argv[context->iterator];
      sVar3 = strlen(pcVar6);
      if ((sVar3 == 1) && (*pcVar6 == '-')) {
        context->current_input_path = (char *)0x0;
        context->current_output_path = context->output_path;
        context_local._4_4_ = 1;
      }
      else {
        context->current_input_path = pcVar6;
        iVar4 = FileSize(pcVar6);
        context->input_file_length = iVar4;
        context->current_output_path = context->output_path;
        if (context->output_path == (char *)0x0) {
          if (context->write_to_stdout == 0) {
            strcpy(context->modified_path,pcVar6);
            context->current_output_path = context->modified_path;
            if (context->decompress == 0) {
              strcpy(context->modified_path + sVar3,context->suffix);
              context_local._4_4_ = 1;
            }
            else {
              sVar3 = strlen(context->suffix);
              __s = FileName(context->modified_path);
              sVar5 = strlen(__s);
              pFVar1 = _stderr;
              if (sVar5 < sVar3 + 1) {
                pcVar6 = PrintablePath(pcVar6);
                fprintf(pFVar1,"empty output file name for [%s] input file\n",pcVar6);
                context->iterator_error = 1;
                context_local._4_4_ = 0;
              }
              else {
                iVar2 = strcmp(context->suffix,__s + (sVar5 - sVar3));
                pFVar1 = _stderr;
                if (iVar2 == 0) {
                  __s[sVar5 - sVar3] = '\0';
                  context_local._4_4_ = 1;
                }
                else {
                  pcVar6 = PrintablePath(pcVar6);
                  fprintf(pFVar1,"input file [%s] suffix mismatch\n",pcVar6);
                  context->iterator_error = 1;
                  context_local._4_4_ = 0;
                }
              }
            }
          }
          else {
            context_local._4_4_ = 1;
          }
        }
        else {
          context_local._4_4_ = 1;
        }
      }
    }
    else {
      context_local._4_4_ = 0;
    }
  }
  return context_local._4_4_;
}

Assistant:

static BROTLI_BOOL NextFile(Context* context) {
  const char* arg;
  size_t arg_len;

  /* Iterator points to last used arg; increment to search for the next one. */
  context->iterator++;

  context->input_file_length = -1;

  /* No input path; read from console. */
  if (context->input_count == 0) {
    if (context->iterator > 1) return BROTLI_FALSE;
    context->current_input_path = NULL;
    /* Either write to the specified path, or to console. */
    context->current_output_path = context->output_path;
    return BROTLI_TRUE;
  }

  /* Skip option arguments. */
  while (context->iterator == context->not_input_indices[context->ignore]) {
    context->iterator++;
    context->ignore++;
  }

  /* All args are scanned already. */
  if (context->iterator >= context->argc) return BROTLI_FALSE;

  /* Iterator now points to the input file name. */
  arg = context->argv[context->iterator];
  arg_len = strlen(arg);
  /* Read from console. */
  if (arg_len == 1 && arg[0] == '-') {
    context->current_input_path = NULL;
    context->current_output_path = context->output_path;
    return BROTLI_TRUE;
  }

  context->current_input_path = arg;
  context->input_file_length = FileSize(arg);
  context->current_output_path = context->output_path;

  if (context->output_path) return BROTLI_TRUE;
  if (context->write_to_stdout) return BROTLI_TRUE;

  strcpy(context->modified_path, arg);
  context->current_output_path = context->modified_path;
  /* If output is not specified, input path suffix should match. */
  if (context->decompress) {
    size_t suffix_len = strlen(context->suffix);
    char* name = (char*)FileName(context->modified_path);
    char* name_suffix;
    size_t name_len = strlen(name);
    if (name_len < suffix_len + 1) {
      fprintf(stderr, "empty output file name for [%s] input file\n",
              PrintablePath(arg));
      context->iterator_error = BROTLI_TRUE;
      return BROTLI_FALSE;
    }
    name_suffix = name + name_len - suffix_len;
    if (strcmp(context->suffix, name_suffix) != 0) {
      fprintf(stderr, "input file [%s] suffix mismatch\n",
              PrintablePath(arg));
      context->iterator_error = BROTLI_TRUE;
      return BROTLI_FALSE;
    }
    name_suffix[0] = 0;
    return BROTLI_TRUE;
  } else {
    strcpy(context->modified_path + arg_len, context->suffix);
    return BROTLI_TRUE;
  }
}